

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH55
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  ulong *puVar3;
  long lVar4;
  PreparedDictionary *pPVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  int *piVar9;
  PreparedDictionary *pPVar10;
  uint uVar11;
  ushort uVar12;
  uint32_t *puVar13;
  long lVar14;
  uint8_t uVar15;
  char cVar16;
  PreparedDictionary *pPVar17;
  ulong uVar18;
  undefined8 *puVar19;
  long lVar20;
  undefined1 *puVar21;
  PreparedDictionary *pPVar22;
  long lVar23;
  long lVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  PreparedDictionary *pPVar31;
  ulong *puVar32;
  uint *puVar33;
  undefined1 *puVar34;
  PreparedDictionary *pPVar35;
  PreparedDictionary *pPVar36;
  PreparedDictionary *pPVar37;
  long lVar38;
  byte bVar39;
  short sVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  PreparedDictionary *pPVar45;
  PreparedDictionary *pPVar46;
  PreparedDictionary *pPVar47;
  ulong *puVar48;
  ulong uVar49;
  ulong uVar50;
  PreparedDictionary *pPVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  PreparedDictionary *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_190;
  ulong local_188;
  ulong local_170;
  ulong local_160;
  ulong local_150;
  size_t *local_148;
  ulong local_128;
  int local_11c;
  PreparedDictionary *local_100;
  ulong auStack_58 [5];
  size_t cur_ix_masked_1;
  
  pPVar17 = (PreparedDictionary *)((1L << (literal_context_lut[8] & 0x3f)) - 0x10);
  pPVar5 = (PreparedDictionary *)((position - 7) + num_bytes);
  pPVar22 = (PreparedDictionary *)position;
  if (7 < num_bytes) {
    pPVar22 = pPVar5;
  }
  lVar23 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar23 = 0x40;
  }
  puVar2 = (undefined1 *)(position + num_bytes);
  lVar4 = position - 1;
  lVar6 = *(long *)(literal_context_lut + 0x10);
  local_190 = *(ulong *)dist_cache;
  pPVar36 = (PreparedDictionary *)(lVar23 + position);
  lVar7 = *(long *)(literal_context_lut + 0x60);
  uVar11 = (uint)ringbuffer_mask;
  local_148 = last_insert_len;
  do {
LAB_00e0c4e5:
    pPVar47 = (PreparedDictionary *)position;
    if (puVar2 <= &pPVar47->source_size) {
      *(undefined1 **)dist_cache = puVar2 + (local_190 - (long)pPVar47);
      *(long *)commands = *(long *)commands + ((long)local_148 - (long)last_insert_len >> 4);
      return;
    }
    local_1a8 = (long)puVar2 - (long)pPVar47;
    pPVar35 = pPVar17;
    if (pPVar47 < pPVar17) {
      pPVar35 = pPVar47;
    }
    pPVar31 = (PreparedDictionary *)((long)&pPVar47->magic + lVar6);
    if (pPVar17 <= pPVar31) {
      pPVar31 = pPVar17;
    }
    uVar18 = (ulong)pPVar47 & ringbuffer_mask;
    puVar3 = (ulong *)(ringbuffer + uVar18);
    uVar15 = ringbuffer[uVar18];
    pPVar37 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
    if (((PreparedDictionary *)((long)pPVar47 - (long)pPVar37) < pPVar47) &&
       (uVar26 = (uint)(PreparedDictionary *)((long)pPVar47 - (long)pPVar37) & uVar11,
       uVar15 == ringbuffer[uVar26])) {
      puVar32 = (ulong *)(ringbuffer + uVar26);
      lVar41 = 0;
      uVar44 = local_1a8;
      puVar48 = puVar3;
LAB_00e0c574:
      if (uVar44 < 8) {
        for (local_188 = 0;
            (uVar44 != local_188 &&
            (*(char *)((long)puVar32 + local_188) == *(char *)((long)puVar48 + local_188)));
            local_188 = local_188 + 1) {
        }
        local_188 = local_188 - lVar41;
      }
      else {
        if (*puVar48 == *puVar32) break;
        uVar50 = *puVar32 ^ *puVar48;
        uVar44 = 0;
        if (uVar50 != 0) {
          for (; (uVar50 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
          }
        }
        local_188 = (uVar44 >> 3 & 0x1fffffff) - lVar41;
      }
      if ((local_188 < 4) || (local_170 = local_188 * 0x87 + 0x78f, local_170 < 0x7e5))
      goto LAB_00e0c5f3;
      uVar15 = *(uint8_t *)((long)puVar3 + local_188);
    }
    else {
LAB_00e0c5f3:
      local_170 = 0x7e4;
      pPVar37 = (PreparedDictionary *)0x0;
      local_188 = 0;
    }
    sVar8 = (params->dictionary).compound.num_chunks;
    lVar41 = *(long *)(ringbuffer + uVar18);
    for (lVar42 = 0; lVar42 != 0x20; lVar42 = lVar42 + 8) {
      *(ulong *)((long)auStack_58 + lVar42) =
           (ulong)((uint)((ulong)(lVar41 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar42 & 0xfffff);
    }
    uVar26 = (uint)pPVar47;
    for (lVar41 = 0; lVar41 != 4; lVar41 = lVar41 + 1) {
      uVar29 = *(uint *)(sVar8 + auStack_58[lVar41] * 4);
      puVar48 = (ulong *)(ringbuffer + (uVar11 & uVar29));
      if (((uVar15 == *(uint8_t *)(local_188 + (long)puVar48)) &&
          (pPVar47 != (PreparedDictionary *)(ulong)uVar29)) &&
         (pPVar45 = (PreparedDictionary *)((long)pPVar47 - (long)(ulong)uVar29), pPVar45 <= pPVar35)
         ) {
        lVar42 = 0;
        uVar44 = local_1a8;
        puVar32 = puVar3;
LAB_00e0c6ba:
        if (uVar44 < 8) {
          for (uVar50 = 0;
              (uVar44 != uVar50 &&
              (*(char *)((long)puVar48 + uVar50) == *(char *)((long)puVar32 + uVar50)));
              uVar50 = uVar50 + 1) {
          }
          uVar50 = uVar50 - lVar42;
        }
        else {
          if (*puVar32 == *puVar48) goto code_r0x00e0c6cb;
          uVar50 = *puVar48 ^ *puVar32;
          uVar44 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
            }
          }
          uVar50 = (uVar44 >> 3 & 0x1fffffff) - lVar42;
        }
        if (3 < uVar50) {
          iVar30 = 0x1f;
          if ((uint)pPVar45 != 0) {
            for (; (uint)pPVar45 >> iVar30 == 0; iVar30 = iVar30 + -1) {
            }
          }
          uVar44 = (ulong)(iVar30 * -0x1e + 0x780) + uVar50 * 0x87;
          if (local_170 < uVar44) {
            uVar15 = *(uint8_t *)((long)puVar3 + uVar50);
            pPVar37 = pPVar45;
            local_170 = uVar44;
            local_188 = uVar50;
          }
        }
      }
    }
    *(uint *)(sVar8 + *(long *)((long)auStack_58 + (ulong)(uVar26 & 0x18)) * 4) = uVar26;
    if (0x1f < local_1a8 && ((ulong)pPVar47 & 3) == 0) {
      for (pPVar45 = (params->dictionary).compound.chunks[1]; pPVar45 <= pPVar47;
          pPVar45 = (PreparedDictionary *)&pPVar45->num_items) {
        uVar29 = (uint)(params->dictionary).compound.total_size;
        uVar27 = uVar29 & 0x3fffffff;
        *(uint *)&(params->dictionary).compound.total_size =
             uVar29 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
             (uint)ringbuffer[(ulong)&pPVar45[1].source_size & ringbuffer_mask] +
             ~(uint)ringbuffer[(ulong)pPVar45 & ringbuffer_mask] *
             *(int *)((params->dictionary).compound.chunks + 3) + 1;
        if (uVar27 < 0x1000000) {
          pPVar51 = (params->dictionary).compound.chunks[0];
          uVar29 = (&pPVar51->magic)[uVar27];
          (&pPVar51->magic)[uVar27] = (uint32_t)pPVar45;
          if ((pPVar45 == pPVar47) && (uVar29 != 0xffffffff)) {
            uVar27 = uVar26 - uVar29;
            if ((PreparedDictionary *)(ulong)uVar27 <= pPVar35) {
              puVar32 = (ulong *)(ringbuffer + (uVar29 & uVar11));
              lVar41 = 0;
              uVar44 = local_1a8;
              puVar48 = puVar3;
LAB_00e0c81c:
              if (uVar44 < 8) {
                for (uVar50 = 0;
                    (uVar44 != uVar50 &&
                    (*(char *)((long)puVar32 + uVar50) == *(char *)((long)puVar48 + uVar50)));
                    uVar50 = uVar50 + 1) {
                }
              }
              else {
                if (*puVar48 == *puVar32) goto code_r0x00e0c82d;
                uVar50 = *puVar32 ^ *puVar48;
                uVar44 = 0;
                if (uVar50 != 0) {
                  for (; (uVar50 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar50 = uVar44 >> 3 & 0x1fffffff;
              }
              uVar50 = uVar50 - lVar41;
              if ((3 < uVar50) && (local_188 < uVar50)) {
                iVar30 = 0x1f;
                if (uVar27 != 0) {
                  for (; uVar27 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                  }
                }
                uVar44 = (ulong)(iVar30 * -0x1e + 0x780) + uVar50 * 0x87;
                if (local_170 < uVar44) {
                  pPVar37 = (PreparedDictionary *)(ulong)uVar27;
                  local_188 = uVar50;
                  local_170 = uVar44;
                }
              }
            }
          }
        }
      }
      (params->dictionary).compound.chunks[1] = (PreparedDictionary *)&pPVar47->num_items;
    }
    pPVar35 = *(PreparedDictionary **)(literal_context_lut + 0x48);
    lVar41 = *(long *)(literal_context_lut + 0x58);
    lVar42 = *(long *)(literal_context_lut + 0x60);
    lVar20 = 0;
LAB_00e0c8d2:
    if (lVar20 != lVar41) {
      piVar9 = *(int **)(literal_context_lut + lVar20 * 8 + 0x68);
      uVar44 = ((*puVar3 << (-(char)piVar9[3] & 0x3fU)) >> (-(char)piVar9[3] & 0x3fU)) *
               0x1fe35a7bd3579bd3 >> (-*(byte *)(piVar9 + 4) & 0x3f);
      lVar38 = (1L << (*(byte *)(piVar9 + 5) & 0x3f)) * 4 + 0x18;
      lVar24 = (1L << (*(byte *)(piVar9 + 4) & 0x3f)) * 2 + lVar38;
      bVar39 = -*(byte *)(piVar9 + 5);
      uVar26 = (uint)*(ushort *)((long)piVar9 + (uVar44 & 0xffffffff) * 2 + lVar38);
      puVar19 = (undefined8 *)((long)piVar9 + (ulong)(uint)piVar9[1] * 4 + lVar24);
      if (*piVar9 != -0x21431220) {
        puVar19 = (undefined8 *)*puVar19;
      }
      pPVar45 = (PreparedDictionary *)
                ((long)pPVar31 + (lVar42 - *(long *)(literal_context_lut + lVar20 * 8 + 0x168)));
      uVar50 = (ulong)(uint)piVar9[2];
      puVar33 = (uint *)((long)piVar9 +
                        (ulong)(uVar26 + piVar9[(ulong)((uint)((int)uVar44 << (bVar39 & 0x1f)) >>
                                                       (bVar39 & 0x1f)) + 6]) * 4 + lVar24);
      uVar26 = (uint)(uVar26 == 0xffff);
      lVar38 = 0;
      local_160 = local_188;
      local_1b0 = local_170;
      do {
        uVar44 = local_170;
        uVar49 = local_188;
        pPVar51 = pPVar37;
        if (lVar38 == 4) {
          do {
            uVar53 = local_1b0;
            pPVar37 = pPVar51;
            uVar43 = local_160;
            local_188 = uVar49;
            local_170 = uVar44;
            do {
              do {
                do {
                  if (uVar26 != 0) {
                    lVar20 = lVar20 + 1;
                    goto LAB_00e0c8d2;
                  }
                  uVar26 = *puVar33;
                  puVar33 = puVar33 + 1;
                  uVar49 = (ulong)(uVar26 & 0x7fffffff);
                  uVar26 = uVar26 & 0x80000000;
                  pPVar51 = (PreparedDictionary *)((long)pPVar45 - uVar49);
                  uVar44 = uVar50 - uVar49;
                  if (local_1a8 <= uVar50 - uVar49) {
                    uVar44 = local_1a8;
                  }
                } while ((((pPVar35 < pPVar51) || (ringbuffer_mask < uVar43 + uVar18)) ||
                         (uVar44 <= uVar43)) ||
                        (ringbuffer[uVar43 + uVar18] !=
                         *(uint8_t *)((long)puVar19 + uVar49 + uVar43)));
                lVar24 = (long)puVar19 + uVar49;
                uVar52 = 0;
                lVar38 = 0;
                puVar48 = puVar3;
                uVar55 = uVar44;
LAB_00e0cb98:
                if (7 < uVar55) {
                  if (*puVar48 == *(ulong *)(lVar24 + uVar52)) goto code_r0x00e0cbaa;
                  uVar49 = *(ulong *)(lVar24 + uVar52) ^ *puVar48;
                  uVar44 = 0;
                  if (uVar49 != 0) {
                    for (; (uVar49 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar49 = (uVar44 >> 3 & 0x1fffffff) - lVar38;
                  goto LAB_00e0cc14;
                }
                lVar38 = uVar49 + uVar44 + (long)puVar19;
                for (; uVar44 != uVar52; uVar52 = uVar52 + 1) {
                  if (*(char *)(lVar24 + uVar52) != *(char *)((long)puVar3 + uVar52)) {
                    lVar38 = uVar52 + lVar24;
                    break;
                  }
                }
                uVar49 = lVar38 - lVar24;
LAB_00e0cc14:
              } while (uVar49 < 4);
              iVar30 = 0x1f;
              if ((uint)pPVar51 != 0) {
                for (; (uint)pPVar51 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                }
              }
              uVar44 = (ulong)(iVar30 * -0x1e + 0x780) + uVar49 * 0x87;
              local_160 = uVar49;
              local_1b0 = uVar44;
            } while (uVar44 <= uVar53);
          } while( true );
        }
        pPVar51 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + lVar38 * 4);
        if (((PreparedDictionary *)((long)pPVar45 - uVar50) < pPVar51) &&
           (lVar24 = (long)pPVar45 - (long)pPVar51, pPVar51 <= pPVar45)) {
          uVar44 = uVar50 - lVar24;
          if (local_1a8 <= uVar50 - lVar24) {
            uVar44 = local_1a8;
          }
          uVar43 = 0;
          uVar49 = uVar44;
LAB_00e0ca04:
          if (uVar49 < 8) {
            for (pcVar25 = (char *)((long)puVar19 + uVar43 + lVar24);
                (uVar44 != uVar43 && (*pcVar25 == *(char *)((long)puVar3 + uVar43)));
                pcVar25 = pcVar25 + 1) {
              uVar43 = uVar43 + 1;
            }
          }
          else {
            uVar53 = *(ulong *)((long)puVar19 + uVar43 + lVar24);
            if (*(ulong *)((long)puVar3 + uVar43) == uVar53) goto code_r0x00e0ca17;
            uVar53 = uVar53 ^ *(ulong *)((long)puVar3 + uVar43);
            uVar44 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
              }
            }
            uVar43 = uVar43 + (uVar44 >> 3 & 0x1fffffff);
          }
          if ((1 < uVar43) && (uVar44 = uVar43 * 0x87 + 0x78f, local_1b0 < uVar44)) {
            if (lVar38 != 0) {
              uVar44 = uVar44 - ((0x1ca10U >> ((byte)lVar38 & 2) & 4) + 0x27);
            }
            if ((local_1b0 < uVar44) &&
               (local_188 = uVar43, pPVar37 = pPVar51, local_170 = uVar44, local_1b0 = uVar44,
               local_160 < uVar43)) {
              local_160 = uVar43;
            }
          }
        }
        lVar38 = lVar38 + 1;
      } while( true );
    }
    if (local_170 < 0x7e5) {
      local_190 = local_190 + 1;
      position = (long)&pPVar47->magic + 1;
      if (pPVar36 < position) {
        if ((PreparedDictionary *)((long)&pPVar36->magic + (ulong)(uint)((int)lVar23 * 4)) <
            position) {
          pPVar47 = (PreparedDictionary *)((long)&pPVar47->bucket_bits + 1);
          if (pPVar5 <= pPVar47) {
            pPVar47 = pPVar5;
          }
          for (; position < pPVar47; position = (size_t)&((PreparedDictionary *)position)->num_items
              ) {
            *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            local_190 = local_190 + 4;
          }
        }
        else {
          pPVar47 = (PreparedDictionary *)((long)&pPVar47->source_size + 1);
          if (pPVar5 <= pPVar47) {
            pPVar47 = pPVar5;
          }
          for (; position < pPVar47; position = (long)&((PreparedDictionary *)position)->magic + 2)
          {
            *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                              (position & ringbuffer_mask)) *
                                                    -0x1ca5842ca8642d00) >> 0x2c) +
                                      ((uint)position & 0x18) & 0xfffff) * 4) = (uint)position;
            local_190 = local_190 + 2;
          }
        }
      }
      goto LAB_00e0c4e5;
    }
    pPVar36 = (PreparedDictionary *)((long)&pPVar47->magic + lVar6 + 1);
    local_128 = (lVar4 + num_bytes) - (long)pPVar47;
    local_11c = 0;
    uVar18 = local_190;
    do {
      pPVar31 = pPVar17;
      if (pPVar36 < pPVar17) {
        pPVar31 = pPVar36;
      }
      local_1a8 = local_1a8 - 1;
      uVar44 = local_188 - 1;
      if (local_1a8 <= local_188 - 1) {
        uVar44 = local_1a8;
      }
      if (4 < *(int *)(literal_context_lut + 4)) {
        uVar44 = 0;
      }
      pPVar45 = (PreparedDictionary *)((long)&pPVar47->magic + 1);
      pPVar51 = pPVar17;
      if (pPVar45 < pPVar17) {
        pPVar51 = pPVar45;
      }
      local_100 = (PreparedDictionary *)((long)&pPVar47->magic + lVar6 + 1);
      if (pPVar17 <= local_100) {
        local_100 = pPVar17;
      }
      uVar49 = (ulong)pPVar45 & ringbuffer_mask;
      puVar3 = (ulong *)(ringbuffer + uVar49);
      cVar16 = *(char *)(uVar44 + (long)puVar3);
      local_1b8 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      uVar50 = 0x7e4;
      if (((PreparedDictionary *)((long)pPVar45 - (long)local_1b8) < pPVar45) &&
         (puVar48 = (ulong *)(ringbuffer +
                             ((uint)(PreparedDictionary *)((long)pPVar45 - (long)local_1b8) & uVar11
                             )), cVar16 == *(char *)(uVar44 + (long)puVar48))) {
        lVar20 = 0;
        uVar43 = local_1a8;
        puVar32 = puVar3;
LAB_00e0ce60:
        if (uVar43 < 8) {
          for (uVar53 = 0;
              (uVar43 != uVar53 &&
              (*(char *)((long)puVar48 + uVar53) == *(char *)((long)puVar32 + uVar53)));
              uVar53 = uVar53 + 1) {
          }
        }
        else {
          if (*puVar32 == *puVar48) goto code_r0x00e0ce71;
          uVar53 = *puVar48 ^ *puVar32;
          uVar43 = 0;
          if (uVar53 != 0) {
            for (; (uVar53 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
            }
          }
          uVar53 = uVar43 >> 3 & 0x1fffffff;
        }
        uVar53 = uVar53 - lVar20;
        if ((uVar53 < 4) || (uVar43 = uVar53 * 0x87 + 0x78f, uVar43 < 0x7e5)) goto LAB_00e0ced6;
        cVar16 = *(char *)((long)puVar3 + uVar53);
        uVar50 = uVar43;
        uVar44 = uVar53;
      }
      else {
LAB_00e0ced6:
        local_1b8 = (PreparedDictionary *)0x0;
      }
      lVar20 = *(long *)(ringbuffer + uVar49);
      for (lVar38 = 0; lVar38 != 0x20; lVar38 = lVar38 + 8) {
        *(ulong *)((long)auStack_58 + lVar38) =
             (ulong)((uint)((ulong)(lVar20 * -0x1ca5842ca8642d00) >> 0x2c) + (int)lVar38 & 0xfffff);
      }
      uVar26 = (uint)pPVar45;
      for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
        uVar29 = *(uint *)(sVar8 + auStack_58[lVar20] * 4);
        puVar48 = (ulong *)(ringbuffer + (uVar11 & uVar29));
        if (((cVar16 == *(char *)(uVar44 + (long)puVar48)) &&
            (pPVar45 != (PreparedDictionary *)(ulong)uVar29)) &&
           (pPVar46 = (PreparedDictionary *)((long)pPVar45 - (long)(ulong)uVar29),
           pPVar46 <= pPVar51)) {
          lVar38 = 0;
          uVar43 = local_1a8;
          puVar32 = puVar3;
LAB_00e0cf8e:
          if (uVar43 < 8) {
            for (uVar53 = 0;
                (uVar43 != uVar53 &&
                (*(char *)((long)puVar48 + uVar53) == *(char *)((long)puVar32 + uVar53)));
                uVar53 = uVar53 + 1) {
            }
            uVar53 = uVar53 - lVar38;
          }
          else {
            if (*puVar32 == *puVar48) goto code_r0x00e0cf9f;
            uVar53 = *puVar48 ^ *puVar32;
            uVar43 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
              }
            }
            uVar53 = (uVar43 >> 3 & 0x1fffffff) - lVar38;
          }
          if (3 < uVar53) {
            iVar30 = 0x1f;
            if ((uint)pPVar46 != 0) {
              for (; (uint)pPVar46 >> iVar30 == 0; iVar30 = iVar30 + -1) {
              }
            }
            uVar43 = (ulong)(iVar30 * -0x1e + 0x780) + uVar53 * 0x87;
            if (uVar50 < uVar43) {
              cVar16 = *(char *)((long)puVar3 + uVar53);
              uVar50 = uVar43;
              uVar44 = uVar53;
              local_1b8 = pPVar46;
            }
          }
        }
      }
      *(uint *)(sVar8 + *(long *)((long)auStack_58 + (ulong)(uVar26 & 0x18)) * 4) = uVar26;
      if (0x1f < local_1a8 && ((ulong)pPVar45 & 3) == 0) {
        for (pPVar46 = (params->dictionary).compound.chunks[1]; pPVar46 <= pPVar45;
            pPVar46 = (PreparedDictionary *)&pPVar46->num_items) {
          uVar29 = (uint)(params->dictionary).compound.total_size;
          uVar27 = uVar29 & 0x3fffffff;
          *(uint *)&(params->dictionary).compound.total_size =
               uVar29 * *(int *)((long)(params->dictionary).compound.chunks + 0x14) +
               (uint)ringbuffer[(ulong)&pPVar46[1].source_size & ringbuffer_mask] +
               ~(uint)ringbuffer[(ulong)pPVar46 & ringbuffer_mask] *
               *(int *)((params->dictionary).compound.chunks + 3) + 1;
          if (uVar27 < 0x1000000) {
            pPVar10 = (params->dictionary).compound.chunks[0];
            uVar29 = (&pPVar10->magic)[uVar27];
            (&pPVar10->magic)[uVar27] = (uint32_t)pPVar46;
            if ((pPVar46 == pPVar45) && (uVar29 != 0xffffffff)) {
              uVar27 = uVar26 - uVar29;
              if ((PreparedDictionary *)(ulong)uVar27 <= pPVar51) {
                puVar32 = (ulong *)(ringbuffer + (uVar29 & uVar11));
                lVar20 = 0;
                uVar43 = local_1a8;
                puVar48 = puVar3;
LAB_00e0d101:
                if (uVar43 < 8) {
                  for (uVar53 = 0;
                      (uVar43 != uVar53 &&
                      (*(char *)((long)puVar32 + uVar53) == *(char *)((long)puVar48 + uVar53)));
                      uVar53 = uVar53 + 1) {
                  }
                }
                else {
                  if (*puVar48 == *puVar32) goto code_r0x00e0d112;
                  uVar53 = *puVar32 ^ *puVar48;
                  uVar43 = 0;
                  if (uVar53 != 0) {
                    for (; (uVar53 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                    }
                  }
                  uVar53 = uVar43 >> 3 & 0x1fffffff;
                }
                uVar53 = uVar53 - lVar20;
                if ((3 < uVar53) && (uVar44 < uVar53)) {
                  iVar30 = 0x1f;
                  if (uVar27 != 0) {
                    for (; uVar27 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                    }
                  }
                  uVar43 = (ulong)(iVar30 * -0x1e + 0x780) + uVar53 * 0x87;
                  if (uVar50 < uVar43) {
                    uVar50 = uVar43;
                    uVar44 = uVar53;
                    local_1b8 = (PreparedDictionary *)(ulong)uVar27;
                  }
                }
              }
            }
          }
        }
        (params->dictionary).compound.chunks[1] =
             (PreparedDictionary *)((long)&pPVar47->num_items + 1);
      }
      lVar20 = 0;
LAB_00e0d1cd:
      if (lVar20 != lVar41) {
        piVar9 = *(int **)(literal_context_lut + lVar20 * 8 + 0x68);
        uVar43 = ((*puVar3 << (-(char)piVar9[3] & 0x3fU)) >> (-(char)piVar9[3] & 0x3fU)) *
                 0x1fe35a7bd3579bd3 >> (-*(byte *)(piVar9 + 4) & 0x3f);
        lVar38 = (1L << (*(byte *)(piVar9 + 5) & 0x3f)) * 4 + 0x18;
        lVar24 = (1L << (*(byte *)(piVar9 + 4) & 0x3f)) * 2 + lVar38;
        bVar39 = -*(byte *)(piVar9 + 5);
        uVar26 = (uint)*(ushort *)((long)piVar9 + (uVar43 & 0xffffffff) * 2 + lVar38);
        puVar19 = (undefined8 *)((long)piVar9 + (ulong)(uint)piVar9[1] * 4 + lVar24);
        if (*piVar9 != -0x21431220) {
          puVar19 = (undefined8 *)*puVar19;
        }
        lVar38 = *(long *)(literal_context_lut + lVar20 * 8 + 0x168);
        pPVar51 = (PreparedDictionary *)((long)local_100 + (lVar42 - lVar38));
        uVar53 = (ulong)(uint)piVar9[2];
        puVar33 = (uint *)((long)piVar9 +
                          (ulong)(uVar26 + piVar9[(ulong)((uint)((int)uVar43 << (bVar39 & 0x1f)) >>
                                                         (bVar39 & 0x1f)) + 6]) * 4 + lVar24);
        uVar26 = (uint)(uVar26 == 0xffff);
        lVar24 = 0;
        local_1b0 = uVar50;
        local_150 = uVar44;
        do {
          uVar43 = uVar44;
          pPVar46 = local_1b8;
          uVar55 = uVar50;
          if (lVar24 == 4) {
            do {
              uVar54 = local_1b0;
              uVar50 = uVar55;
              local_1b8 = pPVar46;
              uVar44 = uVar43;
              uVar52 = local_150;
              do {
                do {
                  do {
                    if (uVar26 != 0) {
                      lVar20 = lVar20 + 1;
                      goto LAB_00e0d1cd;
                    }
                    uVar26 = *puVar33;
                    puVar33 = puVar33 + 1;
                    uVar55 = (ulong)(uVar26 & 0x7fffffff);
                    uVar26 = uVar26 & 0x80000000;
                    pPVar46 = (PreparedDictionary *)((long)pPVar51 - uVar55);
                    uVar43 = uVar53 - uVar55;
                    if (local_1a8 <= uVar53 - uVar55) {
                      uVar43 = local_1a8;
                    }
                  } while ((((pPVar35 < pPVar46) || (ringbuffer_mask < uVar52 + uVar49)) ||
                           (uVar43 <= uVar52)) ||
                          (ringbuffer[uVar52 + uVar49] !=
                           *(uint8_t *)((long)puVar19 + uVar52 + uVar55)));
                  puVar32 = (ulong *)(uVar55 + (long)puVar19);
                  lVar38 = 0;
                  puVar48 = puVar3;
LAB_00e0d495:
                  if (uVar43 < 8) {
                    for (local_150 = 0;
                        (uVar43 != local_150 &&
                        (*(char *)((long)puVar32 + local_150) ==
                         *(char *)((long)puVar48 + local_150))); local_150 = local_150 + 1) {
                    }
                  }
                  else {
                    if (*puVar48 == *puVar32) goto code_r0x00e0d4a7;
                    uVar55 = *puVar32 ^ *puVar48;
                    uVar43 = 0;
                    if (uVar55 != 0) {
                      for (; (uVar55 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                      }
                    }
                    local_150 = uVar43 >> 3 & 0x1fffffff;
                  }
                  local_150 = local_150 - lVar38;
                } while (local_150 < 4);
                iVar30 = 0x1f;
                if ((uint)pPVar46 != 0) {
                  for (; (uint)pPVar46 >> iVar30 == 0; iVar30 = iVar30 + -1) {
                  }
                }
                uVar55 = (ulong)(iVar30 * -0x1e + 0x780) + local_150 * 0x87;
                uVar43 = local_150;
                local_1b0 = uVar55;
              } while (uVar55 <= uVar54);
            } while( true );
          }
          pPVar46 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + lVar24 * 4);
          if (((PreparedDictionary *)((long)pPVar51 - uVar53) < pPVar46) && (pPVar46 <= pPVar51)) {
            uVar43 = (long)pPVar46 + (uVar53 - (long)pPVar51);
            if (local_1a8 <= uVar43) {
              uVar43 = local_1a8;
            }
            lVar14 = (lVar42 - lVar38) - (long)pPVar46;
            uVar55 = 0;
LAB_00e0d310:
            if (uVar43 < 8) {
              pcVar25 = (char *)((long)puVar19 + (long)&pPVar31->magic + uVar55 + lVar14);
              uVar43 = lVar38 + (-(long)pPVar31 - lVar42) + uVar53 + (long)pPVar46;
              if (local_128 < uVar43) {
                uVar43 = local_128;
              }
              for (; (uVar43 != uVar55 && (*pcVar25 == *(char *)((long)puVar3 + uVar55)));
                  pcVar25 = pcVar25 + 1) {
                uVar55 = uVar55 + 1;
              }
            }
            else {
              uVar52 = *(ulong *)((long)puVar19 + (long)&pPVar31->magic + uVar55 + lVar14);
              if (*(ulong *)((long)puVar3 + uVar55) == uVar52) goto code_r0x00e0d323;
              uVar52 = uVar52 ^ *(ulong *)((long)puVar3 + uVar55);
              uVar43 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
              uVar55 = uVar55 + (uVar43 >> 3 & 0x1fffffff);
            }
            if ((1 < uVar55) && (uVar43 = uVar55 * 0x87 + 0x78f, local_1b0 < uVar43)) {
              if (lVar24 != 0) {
                uVar43 = uVar43 - ((0x1ca10U >> ((byte)lVar24 & 2) & 4) + 0x27);
              }
              if ((local_1b0 < uVar43) &&
                 (uVar50 = uVar43, uVar44 = uVar55, local_1b8 = pPVar46, local_1b0 = uVar43,
                 local_150 < uVar55)) {
                local_150 = uVar55;
              }
            }
          }
          lVar24 = lVar24 + 1;
        } while( true );
      }
      if (uVar50 < local_170 + 0xaf) {
        local_100 = (PreparedDictionary *)((long)&pPVar47->magic + lVar6);
        local_1b8 = pPVar37;
        uVar49 = uVar18;
        pPVar45 = pPVar47;
        uVar44 = local_188;
        if (pPVar17 <= local_100) {
          local_100 = pPVar17;
        }
        break;
      }
      uVar49 = local_190 + 4;
      if (local_11c == 3) break;
      uVar49 = uVar18 + 1;
      local_11c = local_11c + 1;
      puVar13 = &pPVar47->source_size;
      pPVar36 = (PreparedDictionary *)((long)&pPVar36->magic + 1);
      local_128 = local_128 - 1;
      local_188 = uVar44;
      uVar18 = uVar49;
      pPVar37 = local_1b8;
      pPVar47 = pPVar45;
      local_170 = uVar50;
    } while ((undefined1 *)((long)puVar13 + 1) < puVar2);
    pPVar36 = (PreparedDictionary *)((long)&local_100->magic + lVar7);
    if (pPVar36 < local_1b8) {
LAB_00e0d5f7:
      puVar21 = (undefined1 *)((long)&local_1b8->hash_bits + 3);
LAB_00e0d5fb:
      if ((local_1b8 <= pPVar36) && (puVar21 != (undefined1 *)0x0)) {
        *(undefined4 *)((long)(hasher->common).extra + 0xc) =
             *(undefined4 *)((hasher->common).extra + 1);
        *(void **)((long)(hasher->common).extra + 4) = (hasher->common).extra[0];
        *(int *)(hasher->common).extra = (int)local_1b8;
      }
    }
    else {
      pPVar47 = (PreparedDictionary *)(long)*(int *)(hasher->common).extra;
      if (local_1b8 != pPVar47) {
        pPVar35 = (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 4);
        puVar21 = (undefined1 *)0x1;
        if (local_1b8 != pPVar35) {
          uVar18 = (long)local_1b8 + (3 - (long)pPVar47);
          if (uVar18 < 7) {
            bVar39 = (byte)((int)uVar18 << 2);
            uVar26 = 0x9750468;
          }
          else {
            uVar18 = (long)local_1b8 + (3 - (long)pPVar35);
            if (6 < uVar18) {
              puVar21 = (undefined1 *)0x2;
              if ((local_1b8 != (PreparedDictionary *)(long)*(int *)((hasher->common).extra + 1)) &&
                 (puVar21 = (undefined1 *)0x3,
                 local_1b8 !=
                 (PreparedDictionary *)(long)*(int *)((long)(hasher->common).extra + 0xc)))
              goto LAB_00e0d5f7;
              goto LAB_00e0d5fb;
            }
            bVar39 = (byte)((int)uVar18 << 2);
            uVar26 = 0xfdb1ace;
          }
          puVar21 = (undefined1 *)(ulong)(uVar26 >> (bVar39 & 0x1f) & 0xf);
        }
        goto LAB_00e0d5fb;
      }
      puVar21 = (undefined1 *)0x0;
    }
    uVar29 = (uint)uVar49;
    *(uint *)local_148 = uVar29;
    uVar27 = (uint)uVar44;
    *(uint *)((long)local_148 + 4) = uVar27;
    puVar1 = (undefined1 *)((ulong)*(uint *)(literal_context_lut + 0x3c) + 0x10);
    uVar26 = 0;
    if (puVar1 <= puVar21) {
      bVar39 = (byte)*(uint *)(literal_context_lut + 0x38);
      puVar34 = puVar21 + ((4L << (bVar39 & 0x3f)) - (ulong)*(uint *)(literal_context_lut + 0x3c)) +
                          -0x10;
      uVar26 = 0x1f;
      uVar28 = (uint)puVar34;
      if (uVar28 != 0) {
        for (; uVar28 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = (uVar26 ^ 0xffffffe0) + 0x1f;
      uVar18 = (ulong)(((ulong)puVar34 >> ((ulong)uVar26 & 0x3f) & 1) != 0);
      lVar41 = (ulong)uVar26 - (ulong)*(uint *)(literal_context_lut + 0x38);
      puVar21 = (undefined1 *)
                ((ulong)(puVar1 + (uVar18 + lVar41 * 2 + 0xfffe << (bVar39 & 0x3f)) +
                                  (ulong)(~(-1 << (bVar39 & 0x1f)) & uVar28)) | lVar41 * 0x400);
      uVar26 = (uint)((long)puVar34 - (uVar18 + 2 << ((byte)uVar26 & 0x3f)) >> (bVar39 & 0x3f));
    }
    *(short *)((long)local_148 + 0xe) = (short)puVar21;
    *(uint *)(local_148 + 1) = uVar26;
    if (5 < uVar49) {
      if (uVar49 < 0x82) {
        uVar26 = 0x1f;
        uVar29 = (uint)(uVar49 - 2);
        if (uVar29 != 0) {
          for (; uVar29 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        uVar29 = (int)(uVar49 - 2 >> ((char)(uVar26 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar26 ^ 0xffffffe0) * 2 + 0x40;
      }
      else if (uVar49 < 0x842) {
        uVar26 = 0x1f;
        if (uVar29 - 0x42 != 0) {
          for (; uVar29 - 0x42 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        uVar29 = (uVar26 ^ 0xffe0) + 0x2a;
      }
      else {
        uVar29 = 0x15;
        if (0x1841 < uVar49) {
          uVar29 = (uint)(ushort)(0x17 - (uVar49 < 0x5842));
        }
      }
    }
    uVar18 = (ulong)(int)uVar27;
    if (uVar18 < 10) {
      uVar26 = uVar27 - 2;
    }
    else if (uVar18 < 0x86) {
      uVar26 = 0x1f;
      uVar27 = (uint)(uVar18 - 6);
      if (uVar27 != 0) {
        for (; uVar27 >> uVar26 == 0; uVar26 = uVar26 - 1) {
        }
      }
      uVar26 = (int)(uVar18 - 6 >> ((char)(uVar26 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar26 ^ 0xffffffe0) * 2 + 0x42;
    }
    else {
      uVar26 = 0x17;
      if (uVar18 < 0x846) {
        uVar26 = 0x1f;
        if (uVar27 - 0x46 != 0) {
          for (; uVar27 - 0x46 >> uVar26 == 0; uVar26 = uVar26 - 1) {
          }
        }
        uVar26 = (uVar26 ^ 0xffe0) + 0x2c;
      }
    }
    uVar12 = (ushort)uVar26;
    sVar40 = (uVar12 & 7) + ((ushort)uVar29 & 7) * 8;
    if (((((ulong)puVar21 & 0x3ff) == 0) && ((ushort)uVar29 < 8)) && (uVar12 < 0x10)) {
      if (7 < uVar12) {
        sVar40 = sVar40 + 0x40;
      }
    }
    else {
      iVar30 = ((uVar29 & 0xffff) >> 3) * 3 + ((uVar26 & 0xffff) >> 3);
      sVar40 = sVar40 + ((ushort)(0x520d40 >> ((char)iVar30 * '\x02' & 0x1fU)) & 0xc0) +
                        (short)iVar30 * 0x40 + 0x40;
    }
    *(short *)((long)local_148 + 0xc) = sVar40;
    *num_commands = *num_commands + uVar49;
    position = (long)&pPVar45->magic + uVar44;
    pPVar47 = pPVar22;
    if (position < pPVar22) {
      pPVar47 = (PreparedDictionary *)position;
    }
    pPVar35 = (PreparedDictionary *)((long)&pPVar45->magic + 2);
    if (local_1b8 < (PreparedDictionary *)(uVar44 >> 2)) {
      pPVar36 = (PreparedDictionary *)(position + (long)local_1b8 * -4);
      if (pPVar36 < pPVar35) {
        pPVar36 = pPVar35;
      }
      pPVar35 = pPVar36;
      if (pPVar47 < pPVar36) {
        pPVar35 = pPVar47;
      }
    }
    pPVar36 = (PreparedDictionary *)((long)&pPVar45->magic + uVar44 * 2 + lVar23);
    local_148 = local_148 + 2;
    for (; pPVar35 < pPVar47; pPVar35 = (PreparedDictionary *)((long)&pPVar35->magic + 1)) {
      *(uint *)(sVar8 + (ulong)((uint)((ulong)(*(long *)(ringbuffer +
                                                        ((ulong)pPVar35 & ringbuffer_mask)) *
                                              -0x1ca5842ca8642d00) >> 0x2c) + ((uint)pPVar35 & 0x18)
                               & 0xfffff) * 4) = (uint)pPVar35;
    }
    local_190 = 0;
  } while( true );
  puVar48 = puVar48 + 1;
  puVar32 = puVar32 + 1;
  uVar44 = uVar44 - 8;
  lVar41 = lVar41 + -8;
  goto LAB_00e0c574;
code_r0x00e0c6cb:
  puVar32 = puVar32 + 1;
  puVar48 = puVar48 + 1;
  uVar44 = uVar44 - 8;
  lVar42 = lVar42 + -8;
  goto LAB_00e0c6ba;
code_r0x00e0c82d:
  puVar48 = puVar48 + 1;
  puVar32 = puVar32 + 1;
  uVar44 = uVar44 - 8;
  lVar41 = lVar41 + -8;
  goto LAB_00e0c81c;
code_r0x00e0cbaa:
  puVar48 = puVar48 + 1;
  uVar55 = uVar55 - 8;
  lVar38 = lVar38 + -8;
  uVar52 = uVar52 + 8;
  goto LAB_00e0cb98;
code_r0x00e0ca17:
  uVar49 = uVar49 - 8;
  uVar43 = uVar43 + 8;
  goto LAB_00e0ca04;
code_r0x00e0ce71:
  puVar32 = puVar32 + 1;
  puVar48 = puVar48 + 1;
  uVar43 = uVar43 - 8;
  lVar20 = lVar20 + -8;
  goto LAB_00e0ce60;
code_r0x00e0cf9f:
  puVar32 = puVar32 + 1;
  puVar48 = puVar48 + 1;
  uVar43 = uVar43 - 8;
  lVar38 = lVar38 + -8;
  goto LAB_00e0cf8e;
code_r0x00e0d112:
  puVar48 = puVar48 + 1;
  puVar32 = puVar32 + 1;
  uVar43 = uVar43 - 8;
  lVar20 = lVar20 + -8;
  goto LAB_00e0d101;
code_r0x00e0d4a7:
  puVar48 = puVar48 + 1;
  puVar32 = puVar32 + 1;
  uVar43 = uVar43 - 8;
  lVar38 = lVar38 + -8;
  goto LAB_00e0d495;
code_r0x00e0d323:
  uVar43 = uVar43 - 8;
  uVar55 = uVar55 + 8;
  goto LAB_00e0d310;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}